

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfswindow.cpp
# Opt level: O3

void __thiscall QEglFSWindow::invalidateSurface(QEglFSWindow *this)

{
  QDebug QVar1;
  int iVar2;
  QLoggingCategory *pQVar3;
  long lVar4;
  QEglFSWindow *this_00;
  EGLSurface pvVar5;
  undefined8 uVar6;
  QEglFSScreen *this_01;
  QEglFSDeviceIntegration *pQVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QDebug local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_surface == (EGLSurface)0x0) goto LAB_0011dd23;
  pQVar3 = QtPrivateLogging::qLcEglDevDebug();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    QVar1.stream = local_48.stream;
    QVar9.m_data = (storage_type *)0x2e;
    QVar9.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar1.stream,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QVar1.stream = local_48.stream;
    QVar10.m_data = (storage_type *)0x1e;
    QVar10.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar1.stream,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_48.stream,this->m_surface);
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QDebug::~QDebug(&local_48);
  }
  lVar4 = (**(code **)(*(long *)this + 0x18))(this);
  iVar2 = eglDestroySurface(*(undefined8 *)(lVar4 + 0x10));
  if (iVar2 == 0) {
    this_00 = (QEglFSWindow *)QtPrivateLogging::qLcEglDevDebug();
    if ((this_00->field_0x11 & 1) != 0) {
      invalidateSurface(this_00);
    }
  }
  pvVar5 = (EGLSurface)eglGetCurrentSurface(0x305a);
  if (pvVar5 == this->m_surface) {
LAB_0011db3f:
    uVar6 = eglGetCurrentDisplay();
    iVar2 = eglMakeCurrent(uVar6,0,0,0);
    pQVar3 = QtPrivateLogging::qLcEglDevDebug();
    if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::debug();
      QVar1.stream = local_48.stream;
      QVar11.m_data = (storage_type *)0x2e;
      QVar11.m_size = (qsizetype)&local_40;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<((QTextStream *)QVar1.stream,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48.stream,' ');
      }
      QVar1.stream = local_48.stream;
      QVar12.m_data = (storage_type *)0x36;
      QVar12.m_size = (qsizetype)&local_40;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<((QTextStream *)QVar1.stream,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48.stream,' ');
      }
      QVar1.stream = local_48.stream;
      QVar13.m_data = (storage_type *)0x36;
      QVar13.m_size = (qsizetype)&local_40;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)QVar1.stream,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48.stream,' ');
      }
      pcVar8 = "true";
      if (iVar2 == 0) {
        pcVar8 = "false";
      }
      QTextStream::operator<<((QTextStream *)local_48.stream,pcVar8);
      if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48.stream,' ');
      }
      QDebug::~QDebug(&local_48);
    }
  }
  else {
    pvVar5 = (EGLSurface)eglGetCurrentSurface(0x3059);
    if (pvVar5 == this->m_surface) goto LAB_0011db3f;
  }
  lVar4 = (**(code **)(*(long *)this + 0x18))(this);
  if (*(EGLSurface *)(lVar4 + 0x18) == this->m_surface) {
    this_01 = (QEglFSScreen *)(**(code **)(*(long *)this + 0x18))(this);
    QEglFSScreen::setPrimarySurface(this_01,(EGLSurface)0x0);
  }
  this->m_surface = (EGLSurface)0x0;
  *(byte *)&(this->m_flags).super_QFlagsStorageHelper<QEglFSWindow::Flag,_4>.
            super_QFlagsStorage<QEglFSWindow::Flag>.i =
       (byte)(this->m_flags).super_QFlagsStorageHelper<QEglFSWindow::Flag,_4>.
             super_QFlagsStorage<QEglFSWindow::Flag>.i & 0xfe;
LAB_0011dd23:
  pQVar7 = qt_egl_device_integration();
  (*pQVar7->_vptr_QEglFSDeviceIntegration[0x17])(pQVar7,this->m_window);
  this->m_window = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSWindow::invalidateSurface()
{
    if (m_surface != EGL_NO_SURFACE) {
        qCDebug(qLcEglDevDebug) << Q_FUNC_INFO << " about to destroy EGLSurface: " << m_surface;

        bool ok = eglDestroySurface(screen()->display(), m_surface);

        if (!ok) {
            qCWarning(qLcEglDevDebug, "QEglFSWindow::invalidateSurface() eglDestroySurface failed!"
                                      " Follow-up errors or memory leaks are possible."
                                      " eglGetError(): %x", eglGetError());
        }

        if (eglGetCurrentSurface(EGL_READ) == m_surface ||
                eglGetCurrentSurface(EGL_DRAW) == m_surface) {
            bool ok = eglMakeCurrent(eglGetCurrentDisplay(), EGL_NO_DISPLAY, EGL_NO_DISPLAY, EGL_NO_CONTEXT);
            qCDebug(qLcEglDevDebug) << Q_FUNC_INFO << " due to eglDestroySurface on *currently* bound surface"
                                    << "we just called eglMakeCurrent(..,0,0,0)! It returned: " << ok;
        }

        if (screen()->primarySurface() == m_surface)
            screen()->setPrimarySurface(EGL_NO_SURFACE);

        m_surface = EGL_NO_SURFACE;
        m_flags = m_flags & ~Created;
    }
    qt_egl_device_integration()->destroyNativeWindow(m_window);
    m_window = 0;
}